

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O3

shared_ptr<Turtle> __thiscall
cinject::InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_>::createInstance
          (InstanceStorage<Turtle,_cinject::ConstructorFactory<Turtle,_void>_> *this,
          InjectionContext *context)

{
  pointer pcVar1;
  InjectionContext *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Turtle> sVar2;
  ContextGuard guard;
  undefined1 local_a1;
  ctor_arg_resolver local_a0;
  long local_98;
  undefined1 local_90 [24];
  char *local_78 [2];
  char local_68 [16];
  ctor_arg_resolver_1st<Turtle> local_58;
  ctor_arg_resolver local_50;
  ContextGuard local_48;
  
  pcVar1 = context[1].componentStack_.
           super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_a0.context_ = (InjectionContext *)local_90;
  if (pcVar1 == (pointer)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Turtle","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,context[1].container_,
               (long)&(context[1].container_)->parentContainer_ + (long)pcVar1);
  }
  local_90._16_8_ = &Turtle::typeinfo;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,local_a0.context_,
             (undefined1 *)((long)&(local_a0.context_)->container_ + local_98));
  ContextGuard::ContextGuard(&local_48,in_RDX,(component_type *)(local_90 + 0x10));
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if (local_a0.context_ != (InjectionContext *)local_90) {
    operator_delete(local_a0.context_);
  }
  ContextGuard::ensureNoCycle(&local_48);
  this->_vptr_InstanceStorage = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Turtle,std::allocator<Turtle>,cinject::ctor_arg_resolver&,cinject::ctor_arg_resolver&,cinject::ctor_arg_resolver_1st<Turtle>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_0x8,(Turtle **)this,
             (allocator<Turtle> *)&local_a1,&local_a0,&local_50,&local_58);
  ContextGuard::~ContextGuard(&local_48);
  sVar2.super___shared_ptr<Turtle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Turtle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Turtle>)sVar2.super___shared_ptr<Turtle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TImplementation> createInstance(InjectionContext* context)
    {
        ContextGuard guard(context, make_component_type<TImplementation>(!name_.empty() ? name_ : type_name<TImplementation>::value()));

        guard.ensureNoCycle();

        return factory_.createInstance(context);
    }